

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model_dict.hpp
# Opt level: O2

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
::add_interaction(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
                  *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_u,
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_v,
                 double *bias)

{
  double dVar1;
  Vartype VVar2;
  Vartype VVar3;
  __type _Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_type sVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  runtime_error *prVar9;
  Quadratic<std::__cxx11::basic_string<char>,_double> *this_00;
  mapped_type mVar10;
  double b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> u;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p1;
  double local_30;
  
  pbVar5 = std::min<std::__cxx11::string>(arg_u,arg_v);
  std::__cxx11::string::string((string *)&u,(string *)pbVar5);
  pbVar5 = std::max<std::__cxx11::string>(arg_u,arg_v);
  std::__cxx11::string::string((string *)&v,(string *)pbVar5);
  VVar2 = this->m_vartype;
  _Var4 = std::operator==(&u,&v);
  if (_Var4) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"No self-loops allowed");
LAB_00140635:
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  VVar3 = this->m_vartype;
  if (VVar3 == NONE && (this->m_linear)._M_h._M_element_count == 0) {
    if (VVar2 == NONE) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar9,
                 "Binary quadratic model is empty. Please set vartype to Vartype::SPIN or Vartype::BINARY"
                );
      goto LAB_00140635;
    }
    this->m_vartype = VVar2;
    b = *bias;
  }
  else {
    dVar1 = *bias;
    b = dVar1;
    if (VVar2 != VVar3 && VVar2 != NONE) {
      if (VVar2 == BINARY && VVar3 == SPIN) {
        b = dVar1 * 0.25;
        this->m_offset = b + this->m_offset;
        add_variable(this,&u,&b);
        add_variable(this,&v,&b);
      }
      else {
        if ((VVar3 != BINARY) || (VVar2 != SPIN)) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar9,"Unknown vartype");
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this->m_offset = this->m_offset + dVar1;
        p1.first._M_dataplus._M_p = (pointer)(dVar1 * -2.0);
        add_variable(this,&u,(double *)&p1);
        p1.first._M_dataplus._M_p = (pointer)(dVar1 * -2.0);
        add_variable(this,&v,(double *)&p1);
        b = dVar1 * 4.0;
      }
      goto LAB_00140572;
    }
  }
  sVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)this,&u);
  if (sVar6 == 0) {
    p1.first._M_dataplus._M_p = (pointer)0x0;
    add_variable(this,&u,(double *)&p1);
  }
  sVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)this,&v);
  if (sVar6 == 0) {
    p1.first._M_dataplus._M_p = (pointer)0x0;
    add_variable(this,&v,(double *)&p1);
  }
LAB_00140572:
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&p1,&u,&v);
  this_00 = &this->m_quadratic;
  sVar7 = std::
          _Hashtable<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&this_00->_M_h,&p1);
  if (sVar7 == 0) {
    mVar10 = 0.0;
  }
  else {
    pmVar8 = std::__detail::
             _Map_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,&p1);
    mVar10 = *pmVar8;
  }
  local_30 = mVar10 + b;
  insert_or_assign<std::pair<std::__cxx11::string,std::__cxx11::string>,double,cimod::pair_hash>
            (this_00,&p1,&local_30);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&p1);
  std::__cxx11::string::~string((string *)&v);
  std::__cxx11::string::~string((string *)&u);
  return;
}

Assistant:

void add_interaction( const IndexType &arg_u, const IndexType &arg_v, const FloatType &bias ) {
      IndexType u = std::min( arg_u, arg_v );
      IndexType v = std::max( arg_u, arg_v );

      Vartype vartype = this->get_vartype();

      if ( u == v ) {
        throw std::runtime_error( "No self-loops allowed" );
      } else {
        // Check vartype when m_linear.empty() is true
        if ( m_linear.empty() && m_vartype == Vartype::NONE ) {
          if ( vartype != Vartype::NONE ) {
            m_vartype = vartype;
          } else {
            throw std::runtime_error(
                "Binary quadratic model is empty. Please set vartype to Vartype::SPIN or Vartype::BINARY" );
          }
        }

        FloatType b = bias;
        if ( ( vartype != Vartype::NONE ) && ( vartype != m_vartype ) ) {
          if ( ( m_vartype == Vartype::SPIN ) && ( vartype == Vartype::BINARY ) ) {
            // convert from binary to spin
            b /= 4;
            add_offset( b );
            add_variable( u, b );
            add_variable( v, b );
          } else if ( ( m_vartype == Vartype::BINARY ) && ( vartype == Vartype::SPIN ) ) {
            // convert from spin to binary
            add_offset( b );
            add_variable( u, -2 * b );
            add_variable( v, -2 * b );
            b *= 4;
          } else {
            throw std::runtime_error( "Unknown vartype" );
          }
        } else {
          if ( m_linear.count( u ) == 0 ) {
            add_variable( u, 0 );
          }
          if ( m_linear.count( v ) == 0 ) {
            add_variable( v, 0 );
          }
        }

        FloatType value = 0;
        std::pair<IndexType, IndexType> p1 = std::make_pair( u, v );
        if ( m_quadratic.count( p1 ) != 0 ) {
          value = m_quadratic[ p1 ];
        }
        insert_or_assign( m_quadratic, p1, value + b );
      }
    }